

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O2

int marshal_digest_algorithm(CBB *cbb,EVP_MD *md,bool with_null)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  uint8_t *puVar4;
  uint uVar5;
  CBB algorithm;
  CBB oid;
  CBB null;
  
  iVar2 = CBB_add_asn1(cbb,&algorithm,0x20000010);
  uVar5 = 0;
  if ((iVar2 != 0) && (iVar2 = CBB_add_asn1(&algorithm,&oid,6), iVar2 != 0)) {
    iVar2 = EVP_MD_type((EVP_MD *)md);
    lVar3 = 0x70;
    puVar1 = "n";
    do {
      puVar4 = puVar1;
      if (lVar3 == 0) {
        ERR_put_error(0x1d,0,0x66,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_extra.cc"
                      ,0xb4);
        return 0;
      }
      lVar3 = lVar3 + -0x10;
      puVar1 = puVar4 + 0x10;
    } while (iVar2 != *(int *)(puVar4 + 0x1c));
    iVar2 = CBB_add_bytes(&oid,puVar4 + 0x10,(ulong)puVar4[0x19]);
    if (iVar2 != 0) {
      if ((with_null) && (iVar2 = CBB_add_asn1(&algorithm,&null,5), iVar2 == 0)) {
        return 0;
      }
      iVar2 = CBB_flush(cbb);
      uVar5 = (uint)(iVar2 != 0);
    }
  }
  return uVar5;
}

Assistant:

static int marshal_digest_algorithm(CBB *cbb, const EVP_MD *md,
                                    bool with_null) {
  CBB algorithm, oid, null;
  if (!CBB_add_asn1(cbb, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&algorithm, &oid, CBS_ASN1_OBJECT)) {
    return 0;
  }

  bool found = false;
  int nid = EVP_MD_type(md);
  for (const auto &mdoid : kMDOIDs) {
    if (nid == mdoid.nid) {
      if (!CBB_add_bytes(&oid, mdoid.oid, mdoid.oid_len)) {
        return 0;
      }
      found = true;
      break;
    }
  }

  if (!found) {
    OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_UNKNOWN_HASH);
    return 0;
  }

  if ((with_null && !CBB_add_asn1(&algorithm, &null, CBS_ASN1_NULL)) ||  //
      !CBB_flush(cbb)) {
    return 0;
  }

  return 1;
}